

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ctype.c
# Opt level: O1

CTypeID lj_ctype_new(CTState *cts,CType **ctp)

{
  uint uVar1;
  CType *pCVar2;
  
  uVar1 = cts->top;
  if (cts->sizetab <= uVar1) {
    lj_ctype_new_cold_1();
  }
  cts->top = uVar1 + 1;
  pCVar2 = cts->tab;
  *ctp = pCVar2 + uVar1;
  pCVar2 = pCVar2 + uVar1;
  pCVar2->info = 0;
  pCVar2->size = 0;
  pCVar2->sib = 0;
  pCVar2->next = 0;
  pCVar2->name = 0;
  return uVar1;
}

Assistant:

CTypeID lj_ctype_new(CTState *cts, CType **ctp)
{
  CTypeID id = cts->top;
  CType *ct;
  lj_assertCTS(cts->L, "uninitialized cts->L");
  if (LJ_UNLIKELY(id >= cts->sizetab)) {
    if (id >= CTID_MAX) lj_err_msg(cts->L, LJ_ERR_TABOV);
#ifdef LUAJIT_CTYPE_CHECK_ANCHOR
    ct = lj_mem_newvec(cts->L, id+1, CType);
    memcpy(ct, cts->tab, id*sizeof(CType));
    memset(cts->tab, 0, id*sizeof(CType));
    lj_mem_freevec(cts->g, cts->tab, cts->sizetab, CType);
    cts->tab = ct;
    cts->sizetab = id+1;
#else
    lj_mem_growvec(cts->L, cts->tab, cts->sizetab, CTID_MAX, CType);
#endif
  }
  cts->top = id+1;
  *ctp = ct = &cts->tab[id];
  ct->info = 0;
  ct->size = 0;
  ct->sib = 0;
  ct->next = 0;
  setgcrefnull(ct->name);
  return id;
}